

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_3dVector *
ON_TriangleNormal(ON_3dVector *__return_storage_ptr__,ON_3dPoint *A,ON_3dPoint *B,ON_3dPoint *C)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar6 = B->x;
  dVar8 = C->x;
  dVar9 = A->x;
  dVar10 = B->y;
  dVar11 = B->z;
  dVar2 = A->y;
  dVar3 = A->z;
  dVar4 = C->y;
  dVar5 = C->z;
  auVar7._0_8_ = (dVar3 - dVar11) * dVar4 + (dVar11 - dVar5) * dVar2 + (dVar5 - dVar3) * dVar10;
  auVar7._8_8_ = (dVar9 - dVar6) * dVar5 + (dVar6 - dVar8) * dVar3 + (dVar8 - dVar9) * dVar11;
  __return_storage_ptr__->x = auVar7._0_8_;
  __return_storage_ptr__->y = auVar7._8_8_;
  dVar6 = (dVar2 - dVar10) * dVar8 + (dVar10 - dVar4) * dVar9 + (dVar4 - dVar2) * dVar6;
  __return_storage_ptr__->z = dVar6;
  dVar9 = ABS(auVar7._0_8_);
  dVar10 = ABS(auVar7._8_8_);
  dVar8 = ABS(dVar6);
  if (dVar10 <= dVar9) {
    if (dVar8 <= dVar9) {
      dVar11 = dVar9;
      if (2.2250738585072014e-308 < dVar9) {
        dVar11 = SQRT((dVar8 / dVar9) * (dVar8 / dVar9) + (dVar10 / dVar9) * (dVar10 / dVar9) + 1.0)
                 * dVar9;
      }
      goto LAB_00525178;
    }
  }
  else if (dVar8 <= dVar10) {
    dVar11 = dVar10;
    if (2.2250738585072014e-308 < dVar10) {
      dVar11 = SQRT((dVar9 / dVar10) * (dVar9 / dVar10) + (dVar8 / dVar10) * (dVar8 / dVar10) + 1.0)
               * dVar10;
    }
    goto LAB_00525178;
  }
  dVar11 = dVar8;
  if (2.2250738585072014e-308 < dVar8) {
    dVar11 = SQRT((dVar10 / dVar8) * (dVar10 / dVar8) + (dVar9 / dVar8) * (dVar9 / dVar8) + 1.0) *
             dVar8;
  }
LAB_00525178:
  if (0.0 < dVar11) {
    auVar1._8_8_ = dVar11;
    auVar1._0_8_ = dVar11;
    auVar7 = divpd(auVar7,auVar1);
    __return_storage_ptr__->x = (double)auVar7._0_8_;
    __return_storage_ptr__->y = (double)auVar7._8_8_;
    __return_storage_ptr__->z = dVar6 / dVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_TriangleNormal(
        const ON_3dPoint& A,
        const ON_3dPoint& B,
        const ON_3dPoint& C
        )
{
  // N = normal to triangle's plane
  ON_3dVector N;
  double a, b, c, d;
  N.x = A.y*(B.z-C.z) + B.y*(C.z-A.z) + C.y*(A.z-B.z);
  N.y = A.z*(B.x-C.x) + B.z*(C.x-A.x) + C.z*(A.x-B.x);
  N.z = A.x*(B.y-C.y) + B.x*(C.y-A.y) + C.x*(A.y-B.y);

  a = fabs(N.x);
  b = fabs(N.y);
  c = fabs(N.z);
  if ( b > a )
  {
    if ( c > b )
    {
      // c is largest
      if ( c > ON_DBL_MIN )
      {
        a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
      }
      else
      {
        d = c;
      }
    }
    else
    {
      if ( b > ON_DBL_MIN )
      {
        // b is largest
        a /= b; c /= b; d = b*sqrt(1.0 + c*c + a*a);
      }
      else
      {
        d = b;
      }
    }
  }
  else if ( c > a )
  {
    // c is largest
    if ( c > ON_DBL_MIN )
    {
      a /= c; b /= c; d = c*sqrt(1.0 + a*a + b*b);
    }
    else
    {
      d = c;
    }
  }
  else if ( a > ON_DBL_MIN )
  {
    // a is largest
    b /= a; c /= a; d = a*sqrt(1.0 + b*b + c*c);
  }
  else
  {
    d = a;
  }

  if ( d > 0.0 )
  {
    N.x /= d; N.y /= d; N.z /= d;
  }

  return N;
}